

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlCtxtPushInput(xmlParserCtxtPtr ctxt,xmlParserInputPtr value)

{
  int iVar1;
  xmlParserInputPtr *ppxVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  iVar5 = -1;
  if (value == (xmlParserInputPtr)0x0 || ctxt == (xmlParserCtxtPtr)0x0) {
    return -1;
  }
  iVar1 = ctxt->inputMax;
  if (ctxt->inputNr < iVar1) {
LAB_00131cf9:
    if ((ctxt->inputNr == 0) && (value->filename != (char *)0x0)) {
      pcVar3 = xmlParserGetDirectory(value->filename);
      if (pcVar3 == (char *)0x0) goto LAB_00131dcb;
    }
    else {
      pcVar3 = (char *)0x0;
    }
    if (ctxt->input_id == 0x7fffffff) {
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_RESOURCE_LIMIT,XML_ERR_FATAL,
                 (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s","Input ID overflow\n");
    }
    else {
      iVar5 = ctxt->inputNr;
      ctxt->inputTab[iVar5] = value;
      ctxt->input = value;
      if ((long)iVar5 == 0) {
        (*xmlFree)(ctxt->directory);
        ctxt->directory = pcVar3;
      }
      iVar5 = ctxt->input_id;
      ctxt->input_id = iVar5 + 1;
      value->id = iVar5;
      iVar5 = ctxt->inputNr;
      ctxt->inputNr = iVar5 + 1;
    }
  }
  else {
    uVar4 = 0x28;
    if ((ctxt->options & 0x80000) == 0) {
      uVar4 = 0x14;
    }
    if (iVar1 < 1) {
      uVar7 = 5;
    }
    else {
      uVar7 = 0xffffffff;
      if ((iVar1 < (int)uVar4) &&
         (uVar6 = iVar1 + 1U >> 1, uVar7 = uVar6 + iVar1, (int)(uVar4 - uVar6) < iVar1)) {
        uVar7 = uVar4;
      }
    }
    if ((int)uVar7 < 0) {
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_RESOURCE_LIMIT,XML_ERR_FATAL,
                 (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                 "Maximum entity nesting depth exceeded");
      xmlHaltParser(ctxt);
      return -1;
    }
    ppxVar2 = (xmlParserInputPtr *)(*xmlRealloc)(ctxt->inputTab,(ulong)uVar7 << 3);
    if (ppxVar2 != (xmlParserInputPtr *)0x0) {
      ctxt->inputTab = ppxVar2;
      ctxt->inputMax = uVar7;
      goto LAB_00131cf9;
    }
LAB_00131dcb:
    xmlCtxtErrMemory(ctxt);
  }
  return iVar5;
}

Assistant:

int
xmlCtxtPushInput(xmlParserCtxtPtr ctxt, xmlParserInputPtr value)
{
    char *directory = NULL;
    int maxDepth;

    if ((ctxt == NULL) || (value == NULL))
        return(-1);

    maxDepth = (ctxt->options & XML_PARSE_HUGE) ? 40 : 20;

    if (ctxt->inputNr >= ctxt->inputMax) {
        xmlParserInputPtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->inputMax, sizeof(tmp[0]),
                                  5, maxDepth);
        if (newSize < 0) {
            xmlFatalErrMsg(ctxt, XML_ERR_RESOURCE_LIMIT,
                           "Maximum entity nesting depth exceeded");
            xmlHaltParser(ctxt);
            return(-1);
        }
        tmp = xmlRealloc(ctxt->inputTab, newSize * sizeof(tmp[0]));
        if (tmp == NULL) {
            xmlErrMemory(ctxt);
            return(-1);
        }
        ctxt->inputTab = tmp;
        ctxt->inputMax = newSize;
    }

    if ((ctxt->inputNr == 0) && (value->filename != NULL)) {
        directory = xmlParserGetDirectory(value->filename);
        if (directory == NULL) {
            xmlErrMemory(ctxt);
            return(-1);
        }
    }

    if (ctxt->input_id >= INT_MAX) {
        xmlFatalErrMsg(ctxt, XML_ERR_RESOURCE_LIMIT, "Input ID overflow\n");
        return(-1);
    }

    ctxt->inputTab[ctxt->inputNr] = value;
    ctxt->input = value;

    if (ctxt->inputNr == 0) {
        xmlFree(ctxt->directory);
        ctxt->directory = directory;
    }

    /*
     * Internally, the input ID is only used to detect parameter entity
     * boundaries. But there are entity loaders in downstream code that
     * detect the main document by checking for "input_id == 1".
     */
    value->id = ctxt->input_id++;

    return(ctxt->inputNr++);
}